

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O2

int Am_Image_Array_Data::remove(char *__filename)

{
  Am_Image_Array_Data *pAVar1;
  Bitmap_Item *this;
  Bitmap_Item **in_RAX;
  undefined8 uVar2;
  Bitmap_Item **extraout_RAX;
  Bitmap_Item *pBVar3;
  Bitmap_Item **ppBVar4;
  Display *pDVar5;
  long lVar6;
  int i;
  long lVar7;
  Am_Image_Array_Data **ppAVar8;
  
  ppAVar8 = &list;
  do {
    pAVar1 = *ppAVar8;
    if (pAVar1 == (Am_Image_Array_Data *)0x0) {
      return (int)in_RAX;
    }
    pDVar5 = pAVar1->main_display;
    if (pDVar5 == (Display *)__filename) {
      if (pAVar1->colors != (XColor *)0x0) {
        uVar2 = XDefaultColormap(pDVar5,*(undefined4 *)(pDVar5 + 0xe0));
        lVar6 = 0;
        for (lVar7 = 0; lVar7 < pAVar1->num_colors; lVar7 = lVar7 + 1) {
          XFreeColors(pAVar1->main_display,uVar2,(long)&pAVar1->colors->pixel + lVar6,1,0);
          lVar6 = lVar6 + 0x10;
        }
        if (pAVar1->colors != (XColor *)0x0) {
          operator_delete__(pAVar1->colors);
        }
        pAVar1->colors = (XColor *)0x0;
        pDVar5 = pAVar1->main_display;
      }
      if ((pDVar5 != (Display *)0x0) && (pAVar1->main_bitmap != 0)) {
        XFreePixmap();
      }
      pAVar1->main_display = (Display *)0x0;
    }
    in_RAX = &pAVar1->head;
    pBVar3 = (Bitmap_Item *)0x0;
    ppBVar4 = in_RAX;
    while (this = *ppBVar4, this != (Bitmap_Item *)0x0) {
      if (this->display == (Display *)__filename) {
        ppBVar4 = &pBVar3->next;
        if (pBVar3 == (Bitmap_Item *)0x0) {
          ppBVar4 = in_RAX;
        }
        *ppBVar4 = this->next;
        Bitmap_Item::~Bitmap_Item(this);
        operator_delete(this);
        in_RAX = extraout_RAX;
        break;
      }
      pBVar3 = this;
      ppBVar4 = &this->next;
    }
    ppAVar8 = &pAVar1->next;
  } while( true );
}

Assistant:

void
Am_Image_Array_Data::remove(Display *display)
{
  Am_Image_Array_Data *curr;
  for (curr = list; curr; curr = curr->next) {
    if (curr->main_display == display) {
      if (curr->colors) {
        int screen_num = DefaultScreen(curr->main_display);
        Colormap c = XDefaultColormap(curr->main_display, screen_num);
        for (int i = 0; i < curr->num_colors; i++)
          XFreeColors(curr->main_display, c, &(curr->colors[i].pixel), 1, 0);
        delete[] curr->colors;
        curr->colors = nullptr;
      }
      if (curr->main_display && curr->main_bitmap)
        XFreePixmap(curr->main_display, curr->main_bitmap);
      curr->main_display = nullptr;
    }
    Bitmap_Item *prev = nullptr;
    Bitmap_Item *curr_index = curr->head;
    while (curr_index) {
      if (curr_index->display == display) {
        if (prev)
          prev->next = curr_index->next;
        else
          curr->head = curr_index->next;
        delete curr_index;
        break;
      }
      prev = curr_index;
      curr_index = curr_index->next;
    }
  }
}